

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O3

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
basic_socket_acceptor<asio::io_context>
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,io_context *context,
          endpoint_type *endpoint,bool reuse_addr,type_conflict param_4)

{
  implementation_type *impl;
  service_type *psVar1;
  undefined7 in_register_00000009;
  int af;
  error_code __ec;
  error_code __ec_00;
  error_code __ec_01;
  error_code __ec_02;
  error_code eVar2;
  error_code ec;
  system_error e;
  error_code local_68;
  key local_58 [2];
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,reuse_addr);
  local_58[0].type_info_ =
       (type_info *)
       &detail::typeid_wrapper<asio::detail::reactive_socket_service<asio::ip::tcp>>::typeinfo;
  local_58[0].id_ = (id *)0x0;
  psVar1 = (service_type *)
           detail::service_registry::do_use_service
                     ((context->super_execution_context).service_registry_,local_58,
                      detail::service_registry::
                      create<asio::detail::reactive_socket_service<asio::ip::tcp>,asio::io_context>,
                      context);
  (this->impl_).service_ = psVar1;
  impl = &(this->impl_).implementation_;
  (this->impl_).implementation_.protocol_.family_ = 2;
  (this->impl_).executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_fns_ =
       (target_fns *)
       execution::detail::any_executor_base::
       target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value,void>::type*)
       ::fns_with_execute;
  (this->impl_).executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_fns_ =
       (object_fns *)
       execution::detail::any_executor_base::
       object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,std::shared_ptr<void>>::value),void>::type*)
       ::fns;
  (this->impl_).executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_.__align = (anon_struct_8_0_00000001_for___align)context;
  *(undefined4 *)
   ((long)&(this->impl_).executor_.
           super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
           .super_any_executor_base.object_ + 0xc) = 0;
  (this->impl_).executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_ = &(this->impl_).executor_;
  (this->impl_).executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .prop_fns_ = (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)execution::
                  any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
                  ::prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>()
                  ::fns;
  (this->impl_).implementation_.super_base_implementation_type.socket_ = -1;
  (this->impl_).implementation_.super_base_implementation_type.state_ = '\0';
  local_68._M_value = 0;
  local_68._M_cat = (error_category *)std::_V2::system_category();
  af = (uint)((endpoint->impl_).data_.base.sa_family != 2) * 8 + 2;
  eVar2 = detail::reactive_socket_service_base::do_open
                    (&psVar1->super_reactive_socket_service_base,
                     &impl->super_base_implementation_type,af,1,6,&local_68);
  if (eVar2._M_value == 0) {
    (this->impl_).implementation_.protocol_.family_ = af;
  }
  __ec._4_4_ = 0;
  __ec._M_value = local_68._M_value;
  if (local_68._M_value != 0) {
    __ec._M_cat = local_68._M_cat;
    std::system_error::system_error((system_error *)local_58,__ec,"open");
    detail::throw_exception<std::system_error>((system_error *)local_58);
    std::system_error::~system_error((system_error *)local_58);
  }
  if ((char)local_34 != '\0') {
    local_58[0].type_info_ = (type_info *)CONCAT44(local_58[0].type_info_._4_4_,1);
    detail::reactive_socket_service<asio::ip::tcp>::
    set_option<asio::detail::socket_option::boolean<1,2>>
              ((this->impl_).service_,impl,(boolean<1,_2> *)local_58,&local_68);
    __ec_00._4_4_ = 0;
    __ec_00._M_value = local_68._M_value;
    if (local_68._M_value != 0) {
      __ec_00._M_cat = local_68._M_cat;
      std::system_error::system_error((system_error *)local_58,__ec_00,"set_option");
      detail::throw_exception<std::system_error>((system_error *)local_58);
      std::system_error::~system_error((system_error *)local_58);
    }
  }
  detail::reactive_socket_service<asio::ip::tcp>::bind
            ((this->impl_).service_,(int)impl,(sockaddr *)endpoint,(socklen_t)&local_68);
  __ec_01._4_4_ = 0;
  __ec_01._M_value = local_68._M_value;
  if (local_68._M_value != 0) {
    __ec_01._M_cat = local_68._M_cat;
    std::system_error::system_error((system_error *)local_58,__ec_01,"bind");
    detail::throw_exception<std::system_error>((system_error *)local_58);
    std::system_error::~system_error((system_error *)local_58);
  }
  detail::reactive_socket_service_base::listen
            (&((this->impl_).service_)->super_reactive_socket_service_base,(int)impl,0x1000);
  __ec_02._4_4_ = 0;
  __ec_02._M_value = local_68._M_value;
  if (local_68._M_value != 0) {
    __ec_02._M_cat = local_68._M_cat;
    std::system_error::system_error((system_error *)local_58,__ec_02,"listen");
    detail::throw_exception<std::system_error>((system_error *)local_58);
    std::system_error::~system_error((system_error *)local_58);
  }
  return;
}

Assistant:

basic_socket_acceptor(ExecutionContext& context,
      const endpoint_type& endpoint, bool reuse_addr = true,
      typename constraint<
        is_convertible<ExecutionContext&, execution_context&>::value
      >::type = 0)
    : impl_(0, 0, context)
  {
    asio::error_code ec;
    const protocol_type protocol = endpoint.protocol();
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
    if (reuse_addr)
    {
      impl_.get_service().set_option(impl_.get_implementation(),
          socket_base::reuse_address(true), ec);
      asio::detail::throw_error(ec, "set_option");
    }
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
    impl_.get_service().listen(impl_.get_implementation(),
        socket_base::max_listen_connections, ec);
    asio::detail::throw_error(ec, "listen");
  }